

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

bool __thiscall
vkt::api::anon_unknown_0::BlittingImages::checkLinearFilteredResult
          (BlittingImages *this,ConstPixelBufferAccess *result,
          ConstPixelBufferAccess *clampedExpected,ConstPixelBufferAccess *unclampedExpected,
          TextureFormat *srcFormat)

{
  TestLog *log;
  bool bVar1;
  float fVar2;
  ConstPixelBufferAccess *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __fd;
  long lVar3;
  allocator<char> local_f2;
  allocator<char> local_f1;
  TextureFormat dstFormat;
  string local_e8;
  string local_c8;
  Vec4 srcMaxDiff;
  Vec4 dstMaxDiff;
  LogSection local_80;
  Vec4 threshold;
  
  log = ((this->super_CopiesAndBlittingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log
  ;
  dstFormat = result->m_format;
  __n = unclampedExpected;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"ClampedSourceImage",(allocator<char> *)&srcMaxDiff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Region with clamped edges on source image.",
             (allocator<char> *)&dstMaxDiff);
  tcu::LogSection::LogSection(&local_80,&local_e8,&local_c8);
  __fd = (int)log;
  tcu::LogSection::write(&local_80,__fd,__buf,(size_t)__n);
  tcu::LogSection::~LogSection(&local_80);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  bVar1 = isFloatFormat(dstFormat);
  if (bVar1) {
    bVar1 = tcu::isSRGB(*srcFormat);
    getFormatThreshold((anon_unknown_0 *)&local_80,srcFormat);
    if (bVar1) {
      fVar2 = 2.0;
    }
    else {
      fVar2 = 1.0;
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_e8,fVar2);
    tcu::operator*((tcu *)&srcMaxDiff,(Vector<float,_4> *)&local_80,(Vector<float,_4> *)&local_e8);
    getFormatThreshold((anon_unknown_0 *)&dstMaxDiff,&dstFormat);
    tcu::max<float,4>((tcu *)&threshold,(Vector<float,_4> *)&srcMaxDiff,
                      (Vector<float,_4> *)&dstMaxDiff);
    bVar1 = tcu::floatThresholdCompare
                      (log,"Compare","Result comparsion",clampedExpected,result,&threshold,
                       COMPARE_LOG_RESULT);
    tcu::TestLog::endSection(log);
    if (bVar1) {
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"NonClampedSourceImage",&local_f2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Region with non-clamped edges on source image.",&local_f1);
    tcu::LogSection::LogSection(&local_80,&local_e8,&local_c8);
    tcu::LogSection::write(&local_80,__fd,__buf_01,(size_t)clampedExpected);
    tcu::LogSection::~LogSection(&local_80);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    bVar1 = tcu::floatThresholdCompare
                      (log,"Compare","Result comparsion",unclampedExpected,result,&threshold,
                       COMPARE_LOG_RESULT);
  }
  else {
    tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&srcMaxDiff);
    tcu::getTextureFormatBitDepth((tcu *)&dstMaxDiff,&dstFormat);
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      fVar2 = (float)((1 << (*(byte *)(dstMaxDiff.m_data + lVar3) & 0x1f)) / 0x100);
      if ((int)fVar2 < 2) {
        fVar2 = 1.4013e-45;
      }
      srcMaxDiff.m_data[lVar3] = fVar2;
    }
    bVar1 = tcu::intThresholdCompare
                      (log,"Compare","Result comparsion",clampedExpected,result,(UVec4 *)&srcMaxDiff
                       ,COMPARE_LOG_RESULT);
    tcu::TestLog::endSection(log);
    if (bVar1) {
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"NonClampedSourceImage",(allocator<char> *)&threshold);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Region with non-clamped edges on source image.",&local_f2);
    tcu::LogSection::LogSection(&local_80,&local_e8,&local_c8);
    tcu::LogSection::write(&local_80,__fd,__buf_00,(size_t)clampedExpected);
    tcu::LogSection::~LogSection(&local_80);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    bVar1 = tcu::intThresholdCompare
                      (log,"Compare","Result comparsion",unclampedExpected,result,
                       (UVec4 *)&srcMaxDiff,COMPARE_LOG_RESULT);
  }
  tcu::TestLog::endSection(log);
  return bVar1;
}

Assistant:

bool BlittingImages::checkLinearFilteredResult (const tcu::ConstPixelBufferAccess&	result,
												const tcu::ConstPixelBufferAccess&	clampedExpected,
												const tcu::ConstPixelBufferAccess&	unclampedExpected,
												const tcu::TextureFormat&			srcFormat)
{
	tcu::TestLog&				log			(m_context.getTestContext().getLog());
	const tcu::TextureFormat	dstFormat	= result.getFormat();
	bool						isOk		= false;

	log << tcu::TestLog::Section("ClampedSourceImage", "Region with clamped edges on source image.");

	if (isFloatFormat(dstFormat))
	{
		const bool		srcIsSRGB	= tcu::isSRGB(srcFormat);
		const tcu::Vec4	srcMaxDiff	= getFormatThreshold(srcFormat) * tcu::Vec4(srcIsSRGB ? 2.0f : 1.0f);
		const tcu::Vec4	dstMaxDiff	= getFormatThreshold(dstFormat);
		const tcu::Vec4	threshold	= tcu::max(srcMaxDiff, dstMaxDiff);

		isOk = tcu::floatThresholdCompare(log, "Compare", "Result comparsion", clampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
		log << tcu::TestLog::EndSection;

		if (!isOk)
		{
			log << tcu::TestLog::Section("NonClampedSourceImage", "Region with non-clamped edges on source image.");
			isOk = tcu::floatThresholdCompare(log, "Compare", "Result comparsion", unclampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
			log << tcu::TestLog::EndSection;
		}
	}
	else
	{
		tcu::UVec4	threshold;
		// Calculate threshold depending on channel width of destination format.
		const tcu::IVec4	bitDepth	= tcu::getTextureFormatBitDepth(dstFormat);
		for (deUint32 i = 0; i < 4; ++i)
			threshold[i] = de::max( (0x1 << bitDepth[i]) / 256, 1);

		isOk = tcu::intThresholdCompare(log, "Compare", "Result comparsion", clampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
		log << tcu::TestLog::EndSection;

		if (!isOk)
		{
			log << tcu::TestLog::Section("NonClampedSourceImage", "Region with non-clamped edges on source image.");
			isOk = tcu::intThresholdCompare(log, "Compare", "Result comparsion", unclampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
			log << tcu::TestLog::EndSection;
		}
	}

	return isOk;
}